

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndexByName(LadderDatabase *this,string_view name)

{
  Entry *pEVar1;
  bool bVar2;
  char *in_RCX;
  Entry **ppEVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  pair<RenX::LadderDatabase::Entry_*,_unsigned_long> pVar6;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  
  rhs._M_len = name._M_str;
  ppEVar3 = &this->m_head;
  uVar4 = 0;
  while ((pEVar1 = *ppEVar3, uVar5 = 0xffffffffffffffff, pEVar1 != (Entry *)0x0 &&
         (rhs._M_str = in_RCX,
         bVar2 = jessilib::equalsi<char,char>
                           ((jessilib *)&pEVar1->most_recent_name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            name._M_len,rhs), uVar5 = uVar4, !bVar2))) {
    ppEVar3 = &pEVar1->next;
    uVar4 = uVar4 + 1;
  }
  pVar6.second = uVar5;
  pVar6.first = pEVar1;
  return pVar6;
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndexByName(std::string_view name) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (jessilib::equalsi(itr->most_recent_name, name)) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}

	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}